

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O3

void __thiscall MercuryJson::JSON::_error(JSON *this,char *expected,char encountered,size_t index)

{
  ostream *poVar1;
  size_t sVar2;
  char _encounter [3];
  size_t len;
  stringstream stream;
  char local_1db [3];
  string local_1d8;
  size_t local_1b8;
  stringstream local_1b0 [16];
  long local_1a0 [47];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  local_1b8 = 0;
  __error_maybe_escape(local_1db,&local_1b8,encountered);
  local_1db[local_1b8] = '\0';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"expected ",9);
  if (expected == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_1a0 + (int)*(undefined8 *)(local_1a0[0] + -0x18));
  }
  else {
    sVar2 = strlen(expected);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,expected,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," at index ",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", but encountered \'",0x13);
  sVar2 = strlen(local_1db);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1db,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
  std::__cxx11::stringbuf::str();
  __error((string *)(local_1db + 3),this->input,index);
}

Assistant:

[[noreturn]] void JSON::_error(const char *expected, char encountered, size_t index) {
        std::stringstream stream;
        char _encounter[3];
        size_t len = 0;
        __error_maybe_escape(_encounter, &len, encountered);
        _encounter[len] = 0;
        stream << "expected " << expected << " at index " << index << ", but encountered '" << _encounter << "'";
        MercuryJson::__error(stream.str(), input, index);
    }